

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::CalcListClipping
               (int items_count,float items_height,int *out_items_display_start,
               int *out_items_display_end)

{
  bool bVar1;
  int mn;
  int iVar2;
  int *in_RDX;
  int *in_RSI;
  int in_EDI;
  float in_XMM0_Da;
  bool is_nav_request;
  int end;
  int start;
  ImVec2 pos;
  ImRect rect;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImRect *in_stack_ffffffffffffff98;
  undefined6 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa6;
  undefined1 in_stack_ffffffffffffffa7;
  int local_58;
  int local_54;
  float fStack_4c;
  ImRect local_48;
  ImRect local_38;
  ImGuiWindow *local_28;
  ImGuiContext *local_20;
  int *local_18;
  int *local_10;
  float local_8;
  int local_4;
  
  local_20 = GImGui;
  local_28 = GImGui->CurrentWindow;
  if ((GImGui->LogEnabled & 1U) == 0) {
    local_18 = in_RDX;
    local_10 = in_RSI;
    local_8 = in_XMM0_Da;
    local_4 = in_EDI;
    bVar1 = GetSkipItemForListClipping();
    if (bVar1) {
      *local_18 = 0;
      *local_10 = 0;
    }
    else {
      local_38.Min = (local_28->ClipRect).Min;
      local_38.Max = (local_28->ClipRect).Max;
      if ((local_20->NavMoveScoringItems & 1U) != 0) {
        ImRect::Add(&local_38,&local_20->NavScoringNoClipRect);
      }
      if ((local_20->NavJustMovedToId != 0) &&
         (local_28->NavLastIds[0] == local_20->NavJustMovedToId)) {
        local_48 = WindowRectRelToAbs((ImGuiWindow *)
                                      CONCAT17(in_stack_ffffffffffffffa7,
                                               CONCAT16(in_stack_ffffffffffffffa6,
                                                        in_stack_ffffffffffffffa0)),
                                      in_stack_ffffffffffffff98);
        ImRect::Add(&local_38,&local_48);
      }
      fStack_4c = (local_28->DC).CursorPos.y;
      local_54 = (int)((local_38.Min.y - fStack_4c) / local_8);
      local_58 = (int)((local_38.Max.y - fStack_4c) / local_8);
      bVar1 = false;
      if (((local_20->NavMoveScoringItems & 1U) != 0) &&
         (bVar1 = false, local_20->NavWindow != (ImGuiWindow *)0x0)) {
        bVar1 = local_20->NavWindow->RootWindowForNav == local_28->RootWindowForNav;
      }
      if ((bVar1) && (local_20->NavMoveClipDir == 2)) {
        local_54 = local_54 + -1;
      }
      if ((bVar1) && (local_20->NavMoveClipDir == 3)) {
        local_58 = local_58 + 1;
      }
      mn = ImClamp<int>(local_54,0,local_4);
      iVar2 = ImClamp<int>(local_58 + 1,mn,local_4);
      *local_10 = mn;
      *local_18 = iVar2;
    }
  }
  else {
    *in_RSI = 0;
    *in_RDX = in_EDI;
  }
  return;
}

Assistant:

void ImGui::CalcListClipping(int items_count, float items_height, int* out_items_display_start, int* out_items_display_end)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (g.LogEnabled)
    {
        // If logging is active, do not perform any clipping
        *out_items_display_start = 0;
        *out_items_display_end = items_count;
        return;
    }
    if (GetSkipItemForListClipping())
    {
        *out_items_display_start = *out_items_display_end = 0;
        return;
    }

    // We create the union of the ClipRect and the scoring rect which at worst should be 1 page away from ClipRect
    // We don't include g.NavId's rectangle in there (unless g.NavJustMovedToId is set) because the rectangle enlargement can get costly.
    ImRect rect = window->ClipRect;
    if (g.NavMoveScoringItems)
        rect.Add(g.NavScoringNoClipRect);
    if (g.NavJustMovedToId && window->NavLastIds[0] == g.NavJustMovedToId)
        rect.Add(WindowRectRelToAbs(window, window->NavRectRel[0])); // Could store and use NavJustMovedToRectRel

    const ImVec2 pos = window->DC.CursorPos;
    int start = (int)((rect.Min.y - pos.y) / items_height);
    int end = (int)((rect.Max.y - pos.y) / items_height);

    // When performing a navigation request, ensure we have one item extra in the direction we are moving to
    // FIXME: Verify this works with tabbing
    const bool is_nav_request = (g.NavMoveScoringItems && g.NavWindow && g.NavWindow->RootWindowForNav == window->RootWindowForNav);
    if (is_nav_request && g.NavMoveClipDir == ImGuiDir_Up)
        start--;
    if (is_nav_request && g.NavMoveClipDir == ImGuiDir_Down)
        end++;

    start = ImClamp(start, 0, items_count);
    end = ImClamp(end + 1, start, items_count);
    *out_items_display_start = start;
    *out_items_display_end = end;
}